

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOrValue * __thiscall
kj::_::ExceptionOrValue::operator=(ExceptionOrValue *this,ExceptionOrValue *other)

{
  undefined8 uVar1;
  Context *pCVar2;
  
  if (other != this) {
    if ((this->exception).ptr.isSet == true) {
      (this->exception).ptr.isSet = false;
      Exception::~Exception(&(this->exception).ptr.field_1.value);
    }
    if ((other->exception).ptr.isSet == true) {
      (this->exception).ptr.field_1.value.ownFile.content.ptr =
           (other->exception).ptr.field_1.value.ownFile.content.ptr;
      (this->exception).ptr.field_1.value.ownFile.content.size_ =
           (other->exception).ptr.field_1.value.ownFile.content.size_;
      (this->exception).ptr.field_1.value.ownFile.content.disposer =
           (other->exception).ptr.field_1.value.ownFile.content.disposer;
      (other->exception).ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (other->exception).ptr.field_1.value.ownFile.content.size_ = 0;
      uVar1 = *(undefined8 *)((long)&(other->exception).ptr.field_1 + 0x20);
      (this->exception).ptr.field_1.value.file = (other->exception).ptr.field_1.value.file;
      *(undefined8 *)((long)&(this->exception).ptr.field_1 + 0x20) = uVar1;
      (this->exception).ptr.field_1.value.description.content.ptr =
           (other->exception).ptr.field_1.value.description.content.ptr;
      (this->exception).ptr.field_1.value.description.content.size_ =
           (other->exception).ptr.field_1.value.description.content.size_;
      (this->exception).ptr.field_1.value.description.content.disposer =
           (other->exception).ptr.field_1.value.description.content.disposer;
      (other->exception).ptr.field_1.value.description.content.ptr = (char *)0x0;
      (other->exception).ptr.field_1.value.description.content.size_ = 0;
      pCVar2 = (other->exception).ptr.field_1.value.context.ptr.ptr;
      (this->exception).ptr.field_1.value.context.ptr.disposer =
           (other->exception).ptr.field_1.value.context.ptr.disposer;
      (this->exception).ptr.field_1.value.context.ptr.ptr = pCVar2;
      (other->exception).ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      memcpy((void *)((long)&(this->exception).ptr.field_1 + 0x50),
             (void *)((long)&(other->exception).ptr.field_1 + 0x50),0x104);
      (this->exception).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOrValue& operator=(ExceptionOrValue&& other) = default;